

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_report_tri_area_normdev(REF_GRID ref_grid)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  double local_140;
  double local_138;
  REF_DBL local_130;
  REF_DBL local_128;
  REF_DBL local_120;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL local;
  REF_DBL area_sign;
  REF_DBL uv_area;
  REF_DBL area;
  REF_DBL normdev;
  REF_DBL max_uv_area;
  REF_DBL min_uv_area;
  REF_DBL max_area;
  REF_DBL min_area;
  REF_DBL min_normdev;
  REF_INT local_98;
  REF_INT id;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  unique0x00012000 = ref_grid->cell[3];
  min_area = 2.0;
  max_area = 1e+200;
  min_uv_area = -1e+200;
  max_uv_area = 1e+200;
  normdev = -1e+200;
  nodes[0x19] = 0;
  do {
    if (stack0xffffffffffffffd8->max <= nodes[0x19]) {
      _ref_private_macro_code_rss_1 = min_area;
      ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&ref_private_macro_code_rss_1,&min_area,3);
      if (ref_grid_local._4_4_ == 0) {
        _ref_private_macro_code_rss_1 = max_area;
        ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&ref_private_macro_code_rss_1,&max_area,3);
        if (ref_grid_local._4_4_ == 0) {
          _ref_private_macro_code_rss_1 = max_uv_area;
          ref_grid_local._4_4_ =
               ref_mpi_min(ref_mpi_00,&ref_private_macro_code_rss_1,&max_uv_area,3);
          if (ref_grid_local._4_4_ == 0) {
            _ref_private_macro_code_rss_1 = min_uv_area;
            ref_grid_local._4_4_ =
                 ref_mpi_max(ref_mpi_00,&ref_private_macro_code_rss_1,&min_uv_area,3);
            if (ref_grid_local._4_4_ == 0) {
              _ref_private_macro_code_rss_1 = normdev;
              ref_grid_local._4_4_ =
                   ref_mpi_max(ref_mpi_00,&ref_private_macro_code_rss_1,&normdev,3);
              if (ref_grid_local._4_4_ == 0) {
                if (ref_mpi_00->id == 0) {
                  printf("normdev %f area %.5e  %.5e uv area  %.5e  %.5e\n",min_area,max_area,
                         min_uv_area,max_uv_area,normdev);
                }
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xf0b,"ref_geom_report_tri_area_normdev",(ulong)ref_grid_local._4_4_,
                       "mpi max");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf09,"ref_geom_report_tri_area_normdev",(ulong)ref_grid_local._4_4_,"mpi max"
                    );
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xf07,"ref_geom_report_tri_area_normdev",(ulong)ref_grid_local._4_4_,"mpi min");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xf05,"ref_geom_report_tri_area_normdev",(ulong)ref_grid_local._4_4_,"mpi min");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xf03,"ref_geom_report_tri_area_normdev",(ulong)ref_grid_local._4_4_,"mpi min");
      }
      return ref_grid_local._4_4_;
    }
    RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],&local_98);
    if (RVar1 == 0) {
      uVar2 = ref_geom_tri_norm_deviation(ref_grid,&local_98,&area);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xef6,"ref_geom_report_tri_area_normdev",(ulong)uVar2,"norm dev");
        return uVar2;
      }
      if (area <= min_area) {
        local_120 = area;
      }
      else {
        local_120 = min_area;
      }
      min_area = local_120;
      uVar2 = ref_node_tri_area(ref_grid->node,&local_98,&uv_area);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xef8,"ref_geom_report_tri_area_normdev",(ulong)uVar2,"vol");
        return uVar2;
      }
      if (uv_area <= max_area) {
        local_128 = uv_area;
      }
      else {
        local_128 = max_area;
      }
      max_area = local_128;
      if (min_uv_area <= uv_area) {
        local_130 = uv_area;
      }
      else {
        local_130 = min_uv_area;
      }
      min_uv_area = local_130;
      min_normdev._4_4_ = (&local_98)[stack0xffffffffffffffd8->node_per];
      uVar2 = ref_geom_uv_area_sign(ref_grid,min_normdev._4_4_,&local);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xefc,"ref_geom_report_tri_area_normdev",(ulong)uVar2,"a sign");
        return uVar2;
      }
      uVar2 = ref_geom_uv_area(ref_grid->geom,&local_98,&area_sign);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xefd,"ref_geom_report_tri_area_normdev",(ulong)uVar2,"uv area");
        return uVar2;
      }
      area_sign = local * area_sign;
      local_138 = area_sign;
      if (max_uv_area < area_sign) {
        local_138 = max_uv_area;
      }
      max_uv_area = local_138;
      local_140 = area_sign;
      if (area_sign < normdev) {
        local_140 = normdev;
      }
      normdev = local_140;
    }
    nodes[0x19] = nodes[0x19] + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_tri_area_normdev(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], id;
  REF_DBL min_normdev, min_area, max_area, min_uv_area, max_uv_area;
  REF_DBL normdev, area, uv_area, area_sign;
  REF_DBL local;

  min_normdev = 2.0;
  min_area = REF_DBL_MAX;
  max_area = REF_DBL_MIN;
  min_uv_area = REF_DBL_MAX;
  max_uv_area = REF_DBL_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    min_normdev = MIN(min_normdev, normdev);
    RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
    min_area = MIN(min_area, area);
    max_area = MAX(max_area, area);
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= area_sign;
    min_uv_area = MIN(min_uv_area, uv_area);
    max_uv_area = MAX(max_uv_area, uv_area);
  }
  local = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &local, &min_normdev, REF_DBL_TYPE), "mpi min");
  local = min_area;
  RSS(ref_mpi_min(ref_mpi, &local, &min_area, REF_DBL_TYPE), "mpi min");
  local = min_uv_area;
  RSS(ref_mpi_min(ref_mpi, &local, &min_uv_area, REF_DBL_TYPE), "mpi min");
  local = max_area;
  RSS(ref_mpi_max(ref_mpi, &local, &max_area, REF_DBL_TYPE), "mpi max");
  local = max_uv_area;
  RSS(ref_mpi_max(ref_mpi, &local, &max_uv_area, REF_DBL_TYPE), "mpi max");

  if (ref_mpi_once(ref_mpi)) {
    printf("normdev %f area %.5e  %.5e uv area  %.5e  %.5e\n", min_normdev,
           min_area, max_area, min_uv_area, max_uv_area);
  }

  return REF_SUCCESS;
}